

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_server.c
# Opt level: O0

int main(void)

{
  int iVar1;
  size_t len;
  size_t sVar2;
  undefined1 local_1128 [8];
  mbedtls_aes_context aes;
  mbedtls_dhm_context dhm;
  mbedtls_rsa_context rsa;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  char *pers;
  uchar local_858 [6];
  uchar buf2 [2];
  uchar hash [32];
  uchar buf [2048];
  mbedtls_net_context client_fd;
  mbedtls_net_context listen_fd;
  size_t buflen;
  size_t n;
  FILE *pFStack_18;
  int ret;
  FILE *f;
  
  f._4_4_ = 0;
  mbedtls_net_init((mbedtls_net_context *)(buf + 0x7fc));
  mbedtls_net_init((mbedtls_net_context *)(buf + 0x7f8));
  mbedtls_rsa_init((mbedtls_rsa_context *)&dhm.pX.p,0,6);
  mbedtls_dhm_init((mbedtls_dhm_context *)(aes.buf + 0x42));
  mbedtls_aes_init((mbedtls_aes_context *)local_1128);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)&rsa.padding);
  printf("\n  . Seeding the random number generator");
  fflush(_stdout);
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  len = strlen("dh_server");
  n._4_4_ = mbedtls_ctr_drbg_seed
                      ((mbedtls_ctr_drbg_context *)&rsa.padding,mbedtls_entropy_func,
                       &ctr_drbg.p_entropy,(uchar *)"dh_server",len);
  if (n._4_4_ == 0) {
    printf("\n  . Reading private key from rsa_priv.txt");
    fflush(_stdout);
    pFStack_18 = fopen("rsa_priv.txt","rb");
    if (pFStack_18 == (FILE *)0x0) {
      n._4_4_ = 1;
      printf(" failed\n  ! Could not open rsa_priv.txt\n  ! Please run rsa_genkey first\n\n");
    }
    else {
      mbedtls_rsa_init((mbedtls_rsa_context *)&dhm.pX.p,0,0);
      n._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.len,0x10,(FILE *)pFStack_18);
      if (n._4_4_ == 0) {
        n._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.N.p,0x10,(FILE *)pFStack_18);
        if (n._4_4_ == 0) {
          n._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.E.p,0x10,(FILE *)pFStack_18);
          if (n._4_4_ == 0) {
            n._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.D.p,0x10,(FILE *)pFStack_18);
            if (n._4_4_ == 0) {
              n._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.P.p,0x10,(FILE *)pFStack_18);
              if (n._4_4_ == 0) {
                n._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.Q.p,0x10,(FILE *)pFStack_18);
                if (n._4_4_ == 0) {
                  n._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.DP.p,0x10,(FILE *)pFStack_18);
                  if (n._4_4_ == 0) {
                    n._4_4_ = mbedtls_mpi_read_file
                                        ((mbedtls_mpi *)&rsa.DQ.p,0x10,(FILE *)pFStack_18);
                    if (n._4_4_ == 0) {
                      sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)&rsa.len);
                      rsa._0_8_ = sVar2 + 7 >> 3;
                      fclose(pFStack_18);
                      printf("\n  . Reading DH parameters from dh_prime.txt");
                      fflush(_stdout);
                      pFStack_18 = fopen("dh_prime.txt","rb");
                      if (pFStack_18 == (FILE *)0x0) {
                        n._4_4_ = 1;
                        printf(
                              " failed\n  ! Could not open dh_prime.txt\n  ! Please run dh_genprime first\n\n"
                              );
                        goto LAB_00107b60;
                      }
                      iVar1 = mbedtls_mpi_read_file((mbedtls_mpi *)&dhm,0x10,(FILE *)pFStack_18);
                      if (iVar1 == 0) {
                        iVar1 = mbedtls_mpi_read_file
                                          ((mbedtls_mpi *)&dhm.P.p,0x10,(FILE *)pFStack_18);
                        if (iVar1 == 0) {
                          fclose(pFStack_18);
                          printf("\n  . Waiting for a remote connection");
                          fflush(_stdout);
                          n._4_4_ = mbedtls_net_bind((mbedtls_net_context *)(buf + 0x7fc),
                                                     (char *)0x0,"11999",0);
                          if (n._4_4_ == 0) {
                            n._4_4_ = mbedtls_net_accept((mbedtls_net_context *)(buf + 0x7fc),
                                                         (mbedtls_net_context *)(buf + 0x7f8),
                                                         (void *)0x0,0,(size_t *)0x0);
                            if (n._4_4_ == 0) {
                              printf("\n  . Sending the server\'s DH parameters");
                              fflush(_stdout);
                              memset(hash + 0x18,0,0x800);
                              sVar2 = mbedtls_mpi_size((mbedtls_mpi *)&dhm);
                              n._4_4_ = mbedtls_dhm_make_params
                                                  ((mbedtls_dhm_context *)(aes.buf + 0x42),
                                                   (int)sVar2,hash + 0x18,&buflen,
                                                   mbedtls_ctr_drbg_random,&rsa.padding);
                              if (n._4_4_ == 0) {
                                mbedtls_sha1(hash + 0x18,buflen,local_858);
                                hash[buflen + 0x18] = rsa.ver._1_1_;
                                hash[buflen + 0x19] = (uchar)rsa.ver;
                                n._4_4_ = mbedtls_rsa_pkcs1_sign
                                                    ((mbedtls_rsa_context *)&dhm.pX.p,
                                                     (_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                                                     (void *)0x0,1,MBEDTLS_MD_SHA256,0,local_858,
                                                     hash + buflen + 0x1a);
                                if (n._4_4_ == 0) {
                                  sVar2 = buflen + 2 + rsa._0_8_;
                                  pers._6_1_ = (undefined1)(sVar2 >> 8);
                                  pers._7_1_ = (undefined1)sVar2;
                                  n._4_4_ = mbedtls_net_send(buf + 0x7f8,(uchar *)((long)&pers + 6),
                                                             2);
                                  if (n._4_4_ == 2) {
                                    n._4_4_ = mbedtls_net_send(buf + 0x7f8,hash + 0x18,sVar2);
                                    if (n._4_4_ == (uint)sVar2) {
                                      printf("\n  . Receiving the client\'s public value");
                                      fflush(_stdout);
                                      memset(hash + 0x18,0,0x800);
                                      n._4_4_ = mbedtls_net_recv(buf + 0x7f8,hash + 0x18,buflen);
                                      if (n._4_4_ == (uint)buflen) {
                                        n._4_4_ = mbedtls_dhm_read_public
                                                            ((mbedtls_dhm_context *)(aes.buf + 0x42)
                                                             ,hash + 0x18,aes.buf._264_8_);
                                        if (n._4_4_ == 0) {
                                          printf("\n  . Shared secret: ");
                                          fflush(_stdout);
                                          n._4_4_ = mbedtls_dhm_calc_secret
                                                              ((mbedtls_dhm_context *)
                                                               (aes.buf + 0x42),hash + 0x18,0x800,
                                                               &buflen,mbedtls_ctr_drbg_random,
                                                               &rsa.padding);
                                          if (n._4_4_ == 0) {
                                            n._4_4_ = 0;
                                            for (buflen = 0; buflen < 0x10; buflen = buflen + 1) {
                                              printf("%02x",(ulong)hash[buflen + 0x18]);
                                            }
                                            printf("...\n  . Encrypting and sending the ciphertext")
                                            ;
                                            fflush(_stdout);
                                            mbedtls_aes_setkey_enc
                                                      ((mbedtls_aes_context *)local_1128,hash + 0x18
                                                       ,0x100);
                                            builtin_memcpy(hash + 0x18,"==Hello ",8);
                                            builtin_memcpy(buf,"there!==",8);
                                            mbedtls_aes_crypt_ecb
                                                      ((mbedtls_aes_context *)local_1128,1,
                                                       hash + 0x18,hash + 0x18);
                                            n._4_4_ = mbedtls_net_send(buf + 0x7f8,hash + 0x18,0x10)
                                            ;
                                            if (n._4_4_ == 0x10) {
                                              printf("\n\n");
                                            }
                                            else {
                                              printf(" failed\n  ! mbedtls_net_send returned %d\n\n"
                                                     ,(ulong)n._4_4_);
                                            }
                                          }
                                          else {
                                            printf(
                                                  " failed\n  ! mbedtls_dhm_calc_secret returned %d\n\n"
                                                  ,(ulong)n._4_4_);
                                          }
                                        }
                                        else {
                                          printf(" failed\n  ! mbedtls_dhm_read_public returned %d\n\n"
                                                 ,(ulong)n._4_4_);
                                        }
                                      }
                                      else {
                                        printf(" failed\n  ! mbedtls_net_recv returned %d\n\n",
                                               (ulong)n._4_4_);
                                      }
                                      goto LAB_00107b60;
                                    }
                                  }
                                  printf(" failed\n  ! mbedtls_net_send returned %d\n\n",
                                         (ulong)n._4_4_);
                                }
                                else {
                                  printf(" failed\n  ! mbedtls_rsa_pkcs1_sign returned %d\n\n",
                                         (ulong)n._4_4_);
                                }
                              }
                              else {
                                printf(" failed\n  ! mbedtls_dhm_make_params returned %d\n\n",
                                       (ulong)n._4_4_);
                              }
                            }
                            else {
                              printf(" failed\n  ! mbedtls_net_accept returned %d\n\n",
                                     (ulong)n._4_4_);
                            }
                          }
                          else {
                            printf(" failed\n  ! mbedtls_net_bind returned %d\n\n",(ulong)n._4_4_);
                          }
                          goto LAB_00107b60;
                        }
                      }
                      printf(" failed\n  ! Invalid DH parameter file\n\n");
                      fclose(pFStack_18);
                      goto LAB_00107b60;
                    }
                  }
                }
              }
            }
          }
        }
      }
      printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)n._4_4_);
      fclose(pFStack_18);
    }
  }
  else {
    printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)n._4_4_);
  }
LAB_00107b60:
  mbedtls_net_free((mbedtls_net_context *)(buf + 0x7f8));
  mbedtls_net_free((mbedtls_net_context *)(buf + 0x7fc));
  mbedtls_aes_free((mbedtls_aes_context *)local_1128);
  mbedtls_rsa_free((mbedtls_rsa_context *)&dhm.pX.p);
  mbedtls_dhm_free((mbedtls_dhm_context *)(aes.buf + 0x42));
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)&rsa.padding);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  return n._4_4_;
}

Assistant:

int main( void )
{
    FILE *f;

    int ret;
    size_t n, buflen;
    mbedtls_net_context listen_fd, client_fd;

    unsigned char buf[2048];
    unsigned char hash[32];
    unsigned char buf2[2];
    const char *pers = "dh_server";

    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_rsa_context rsa;
    mbedtls_dhm_context dhm;
    mbedtls_aes_context aes;

    mbedtls_net_init( &listen_fd );
    mbedtls_net_init( &client_fd );
    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, MBEDTLS_MD_SHA256 );
    mbedtls_dhm_init( &dhm );
    mbedtls_aes_init( &aes );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    /*
     * 1. Setup the RNG
     */
    mbedtls_printf( "\n  . Seeding the random number generator" );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    /*
     * 2a. Read the server's private RSA key
     */
    mbedtls_printf( "\n  . Reading private key from rsa_priv.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_priv.txt", "rb" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not open rsa_priv.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );

    if( ( ret = mbedtls_mpi_read_file( &rsa.N , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.E , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.D , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.P , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.Q , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.DP, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.DQ, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.QP, 16, f ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n", ret );
        fclose( f );
        goto exit;
    }

    rsa.len = ( mbedtls_mpi_bitlen( &rsa.N ) + 7 ) >> 3;

    fclose( f );

    /*
     * 2b. Get the DHM modulus and generator
     */
    mbedtls_printf( "\n  . Reading DH parameters from dh_prime.txt" );
    fflush( stdout );

    if( ( f = fopen( "dh_prime.txt", "rb" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not open dh_prime.txt\n" \
                "  ! Please run dh_genprime first\n\n" );
        goto exit;
    }

    if( mbedtls_mpi_read_file( &dhm.P, 16, f ) != 0 ||
        mbedtls_mpi_read_file( &dhm.G, 16, f ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Invalid DH parameter file\n\n" );
        fclose( f );
        goto exit;
    }

    fclose( f );

    /*
     * 3. Wait for a client to connect
     */
    mbedtls_printf( "\n  . Waiting for a remote connection" );
    fflush( stdout );

    if( ( ret = mbedtls_net_bind( &listen_fd, NULL, SERVER_PORT, MBEDTLS_NET_PROTO_TCP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_bind returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_net_accept( &listen_fd, &client_fd,
                                    NULL, 0, NULL ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_accept returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 4. Setup the DH parameters (P,G,Ys)
     */
    mbedtls_printf( "\n  . Sending the server's DH parameters" );
    fflush( stdout );

    memset( buf, 0, sizeof( buf ) );

    if( ( ret = mbedtls_dhm_make_params( &dhm, (int) mbedtls_mpi_size( &dhm.P ), buf, &n,
                                 mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_make_params returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 5. Sign the parameters and send them
     */
    mbedtls_sha1( buf, n, hash );

    buf[n    ] = (unsigned char)( rsa.len >> 8 );
    buf[n + 1] = (unsigned char)( rsa.len      );

    if( ( ret = mbedtls_rsa_pkcs1_sign( &rsa, NULL, NULL, MBEDTLS_RSA_PRIVATE, MBEDTLS_MD_SHA256,
                                0, hash, buf + n + 2 ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_sign returned %d\n\n", ret );
        goto exit;
    }

    buflen = n + 2 + rsa.len;
    buf2[0] = (unsigned char)( buflen >> 8 );
    buf2[1] = (unsigned char)( buflen      );

    if( ( ret = mbedtls_net_send( &client_fd, buf2, 2 ) ) != 2 ||
        ( ret = mbedtls_net_send( &client_fd, buf, buflen ) ) != (int) buflen )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_send returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 6. Get the client's public value: Yc = G ^ Xc mod P
     */
    mbedtls_printf( "\n  . Receiving the client's public value" );
    fflush( stdout );

    memset( buf, 0, sizeof( buf ) );

    if( ( ret = mbedtls_net_recv( &client_fd, buf, n ) ) != (int) n )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_recv returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_dhm_read_public( &dhm, buf, dhm.len ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_read_public returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 7. Derive the shared secret: K = Ys ^ Xc mod P
     */
    mbedtls_printf( "\n  . Shared secret: " );
    fflush( stdout );

    if( ( ret = mbedtls_dhm_calc_secret( &dhm, buf, sizeof( buf ), &n,
                                 mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_calc_secret returned %d\n\n", ret );
        goto exit;
    }

    for( n = 0; n < 16; n++ )
        mbedtls_printf( "%02x", buf[n] );

    /*
     * 8. Setup the AES-256 encryption key
     *
     * This is an overly simplified example; best practice is
     * to hash the shared secret with a random value to derive
     * the keying material for the encryption/decryption keys
     * and MACs.
     */
    mbedtls_printf( "...\n  . Encrypting and sending the ciphertext" );
    fflush( stdout );

    mbedtls_aes_setkey_enc( &aes, buf, 256 );
    memcpy( buf, PLAINTEXT, 16 );
    mbedtls_aes_crypt_ecb( &aes, MBEDTLS_AES_ENCRYPT, buf, buf );

    if( ( ret = mbedtls_net_send( &client_fd, buf, 16 ) ) != 16 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_send returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( "\n\n" );

exit:

    mbedtls_net_free( &client_fd );
    mbedtls_net_free( &listen_fd );

    mbedtls_aes_free( &aes );
    mbedtls_rsa_free( &rsa );
    mbedtls_dhm_free( &dhm );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}